

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

string * __thiscall
QPDFJob::getMessagePrefix_abi_cxx11_(string *__return_storage_ptr__,QPDFJob *this)

{
  element_type *peVar1;
  pointer pcVar2;
  
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (peVar1->message_prefix)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (peVar1->message_prefix)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFJob::getMessagePrefix() const
{
    return m->message_prefix;
}